

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O3

size_t __thiscall
SGParser::Generator::GrammarOutputC::CreateProductionSwitch
          (GrammarOutputC *this,String *str,String *className,String *stackName,String *prefix,
          String *enumClassName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  key_type *__k;
  bool bVar3;
  uint *puVar4;
  pointer pcVar5;
  Production *pPVar6;
  size_t __n;
  GrammarOutputC *pGVar7;
  int iVar8;
  long *plVar9;
  mapped_type *ppbVar10;
  long *plVar11;
  size_type *psVar12;
  size_t *psVar13;
  ulong uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  long lVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  size_t sVar19;
  long *local_190 [2];
  long local_180 [2];
  GrammarOutputC *local_170;
  size_t local_168;
  String *local_160;
  String *local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_150;
  undefined1 auStack_148 [8];
  vector<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
  prods;
  undefined1 local_120 [8];
  String tab;
  String dest;
  map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  grammarSymbolsInv;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->super_GrammarOutput).pGrammar == (Grammar *)0x0) {
    return 0;
  }
  local_120 = (undefined1  [8])&tab._M_string_length;
  local_160 = prefix;
  local_158 = enumClassName;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"    ","");
  tab.field_2._8_8_ = &dest._M_string_length;
  dest._M_dataplus._M_p = (pointer)0x0;
  dest._M_string_length._0_1_ = 0;
  local_150 = &this->namespaceName;
  if ((this->namespaceName)._M_string_length != 0) {
    std::operator+(&local_50,"namespace ",local_150);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
    p_Var2 = &grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header;
    plVar11 = plVar9 + 2;
    if ((long *)*plVar9 == plVar11) {
      grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = *plVar11;
      grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)plVar9[3];
      dest.field_2._8_8_ = p_Var2;
    }
    else {
      grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = *plVar11;
      dest.field_2._8_8_ = (long *)*plVar9;
    }
    grammarSymbolsInv._M_t._M_impl._0_8_ = plVar9[1];
    *plVar9 = (long)plVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::_M_append(tab.field_2._M_local_buf + 8,dest.field_2._8_8_);
    if ((_Rb_tree_header *)dest.field_2._8_8_ != p_Var2) {
      operator_delete((void *)dest.field_2._8_8_,
                      grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  std::operator+(&local_90,"bool ",className);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_90);
  paVar1 = &local_70.field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_70.field_2._M_allocated_capacity = *psVar12;
    local_70.field_2._8_8_ = plVar9[3];
    local_70._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar12;
    local_70._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_70._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_70,(ulong)(stackName->_M_dataplus)._M_p);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_50.field_2._M_allocated_capacity = *psVar12;
    local_50.field_2._8_8_ = plVar9[3];
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar12;
    local_50._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_50._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
  p_Var2 = &grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header;
  plVar11 = plVar9 + 2;
  if ((long *)*plVar9 == plVar11) {
    grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = *plVar11;
    grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)plVar9[3];
    dest.field_2._8_8_ = p_Var2;
  }
  else {
    grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = *plVar11;
    dest.field_2._8_8_ = (long *)*plVar9;
  }
  grammarSymbolsInv._M_t._M_impl._0_8_ = plVar9[1];
  *plVar9 = (long)plVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::_M_append(tab.field_2._M_local_buf + 8,dest.field_2._8_8_);
  if ((_Rb_tree_header *)dest.field_2._8_8_ != p_Var2) {
    operator_delete((void *)dest.field_2._8_8_,
                    grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (this->useEnumClasses == true) {
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_120,tab._M_dataplus._M_p + (long)local_120);
    std::__cxx11::string::append((char *)&local_70);
    plVar9 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_70,(ulong)(local_158->_M_dataplus)._M_p);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    psVar12 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_50.field_2._M_allocated_capacity = *psVar12;
      local_50.field_2._8_8_ = plVar9[3];
    }
    else {
      local_50.field_2._M_allocated_capacity = *psVar12;
      local_50._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_50._M_string_length = plVar9[1];
    *plVar9 = (long)psVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
    plVar11 = plVar9 + 2;
    if ((long *)*plVar9 == plVar11) {
      grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = *plVar11;
      grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)plVar9[3];
      dest.field_2._8_8_ = p_Var2;
    }
    else {
      grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = *plVar11;
      dest.field_2._8_8_ = (long *)*plVar9;
    }
    grammarSymbolsInv._M_t._M_impl._0_8_ = plVar9[1];
    *plVar9 = (long)plVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::_M_append(tab.field_2._M_local_buf + 8,dest.field_2._8_8_);
    if ((_Rb_tree_header *)dest.field_2._8_8_ != p_Var2) {
      operator_delete((void *)dest.field_2._8_8_,
                      grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    uVar15 = local_70.field_2._M_allocated_capacity;
    uVar16 = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == paVar1) goto LAB_00121e1d;
  }
  else {
    dest.field_2._8_8_ = p_Var2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&dest.field_2 + 8),local_120,tab._M_dataplus._M_p + (long)local_120)
    ;
    std::__cxx11::string::append(dest.field_2._M_local_buf + 8);
    std::__cxx11::string::_M_append(tab.field_2._M_local_buf + 8,dest.field_2._8_8_);
    uVar15 = grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
    uVar16 = dest.field_2._8_8_;
    if ((_Rb_tree_header *)dest.field_2._8_8_ == p_Var2) goto LAB_00121e1d;
  }
  operator_delete((void *)uVar16,uVar15 + 1);
LAB_00121e1d:
  dest.field_2._8_8_ = p_Var2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&dest.field_2 + 8),local_120,tab._M_dataplus._M_p + (long)local_120);
  std::__cxx11::string::append(dest.field_2._M_local_buf + 8);
  std::__cxx11::string::_M_append(tab.field_2._M_local_buf + 8,dest.field_2._8_8_);
  if ((_Rb_tree_header *)dest.field_2._8_8_ != p_Var2) {
    operator_delete((void *)dest.field_2._8_8_,
                    grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&grammarSymbolsInv;
  grammarSymbolsInv._M_t._M_impl._0_8_ = grammarSymbolsInv._M_t._M_impl._0_8_ & 0xffffffff00000000;
  grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  Grammar::CreateInverseSymbols
            ((this->super_GrammarOutput).pGrammar,
             (map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
              *)((long)&dest.field_2 + 8));
  auStack_148 = (undefined1  [8])0x0;
  prods.
  super__Vector_base<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  prods.
  super__Vector_base<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_170 = this;
  local_168 = Grammar::CreateProductionVector
                        ((this->super_GrammarOutput).pGrammar,
                         (vector<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
                          *)auStack_148);
  if (1 < local_168) {
    sVar19 = 1;
    do {
      psVar13 = &grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count;
      if (((*(pointer)((long)auStack_148 + sVar19 * 8))->Name)._M_string_length == 0) {
        sVar19 = 0;
        goto LAB_00122a5d;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar13,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120)
      ;
      plVar9 = (long *)std::__cxx11::string::append((char *)psVar13);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      psVar12 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_90.field_2._M_allocated_capacity = *psVar12;
        local_90.field_2._8_8_ = plVar9[3];
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar12;
        local_90._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_90._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      ppbVar10 = std::
                 map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                 ::operator[]((map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                               *)((long)&dest.field_2 + 8),
                              &(*(pointer)((long)auStack_148 + sVar19 * 8))->Left);
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_90,(ulong)((*ppbVar10)->_M_dataplus)._M_p);
      psVar12 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_70.field_2._M_allocated_capacity = *psVar12;
        local_70.field_2._8_8_ = plVar9[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar12;
        local_70._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_70._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      psVar12 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_50.field_2._M_allocated_capacity = *psVar12;
        local_50.field_2._8_8_ = plVar9[3];
      }
      else {
        local_50.field_2._M_allocated_capacity = *psVar12;
        local_50._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_50._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::_M_append(tab.field_2._M_local_buf + 8,(ulong)local_50._M_dataplus._M_p)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count != &local_a0) {
        operator_delete((void *)grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        local_a0._M_allocated_capacity + 1);
      }
      if ((*(pointer)((long)auStack_148 + sVar19 * 8))->Length == 0) {
        std::__cxx11::string::append(tab.field_2._M_local_buf + 8);
      }
      else {
        lVar17 = 4;
        for (uVar14 = 0; uVar14 < (*(pointer)((long)auStack_148 + sVar19 * 8))->Length;
            uVar14 = uVar14 + 1) {
          puVar4 = (*(pointer)((long)auStack_148 + sVar19 * 8))->pRight;
          __k = (key_type *)((long)puVar4 + lVar17);
          if (*(int *)((long)puVar4 + lVar17) < 0) {
            ppbVar10 = std::
                       map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                       ::operator[]((map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                                     *)((long)&dest.field_2 + 8),__k);
            std::operator+(&local_70,"\'",*ppbVar10);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_50.field_2._M_allocated_capacity = *psVar12;
              local_50.field_2._8_8_ = plVar9[3];
            }
            else {
              local_50.field_2._M_allocated_capacity = *psVar12;
              local_50._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_50._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::string::_M_append
                      (tab.field_2._M_local_buf + 8,(ulong)local_50._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            ppbVar10 = std::
                       map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                       ::operator[]((map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                                     *)((long)&dest.field_2 + 8),__k);
            std::__cxx11::string::_M_append
                      (tab.field_2._M_local_buf + 8,(ulong)((*ppbVar10)->_M_dataplus)._M_p);
          }
          lVar17 = lVar17 + 4;
          std::__cxx11::string::append(tab.field_2._M_local_buf + 8);
        }
      }
      std::__cxx11::string::append(tab.field_2._M_local_buf + 8);
      std::operator+(&local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120)
      ;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      psVar12 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_70.field_2._M_allocated_capacity = *psVar12;
        local_70.field_2._8_8_ = plVar9[3];
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar12;
        local_70._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_70._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      bVar3 = local_170->useEnumClasses;
      if (bVar3 == true) {
        local_190[0] = local_180;
        pcVar5 = (local_158->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_190,pcVar5,pcVar5 + local_158->_M_string_length);
        std::__cxx11::string::append((char *)local_190);
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_190,(ulong)(local_160->_M_dataplus)._M_p);
        grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&local_a0;
        psVar12 = (size_type *)(plVar9 + 2);
        if ((size_type *)*plVar9 == psVar12) {
          local_a0._M_allocated_capacity = *psVar12;
          local_a0._8_8_ = plVar9[3];
        }
        else {
          local_a0._M_allocated_capacity = *psVar12;
          grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)*plVar9;
        }
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
      }
      else {
        grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&local_a0;
        pcVar5 = (local_160->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   pcVar5,pcVar5 + local_160->_M_string_length);
      }
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_70,
                                  grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count
                                 );
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      psVar12 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_50.field_2._M_allocated_capacity = *psVar12;
        local_50.field_2._8_8_ = plVar9[3];
      }
      else {
        local_50.field_2._M_allocated_capacity = *psVar12;
        local_50._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_50._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::_M_append(tab.field_2._M_local_buf + 8,(ulong)local_50._M_dataplus._M_p)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count != &local_a0) {
        operator_delete((void *)grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        local_a0._M_allocated_capacity + 1);
      }
      if ((bVar3 != false) && (local_190[0] != local_180)) {
        operator_delete(local_190[0],local_180[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      psVar13 = &grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      pPVar6 = *(pointer)((long)auStack_148 + sVar19 * 8);
      __n = (pPVar6->Name)._M_string_length;
      if ((__n == ((*(pointer)((long)auStack_148 + (sVar19 - 1) * 8))->Name)._M_string_length) &&
         ((__n == 0 ||
          (iVar8 = bcmp((pPVar6->Name)._M_dataplus._M_p,
                        ((*(pointer)((long)auStack_148 + (sVar19 - 1) * 8))->Name)._M_dataplus._M_p,
                        __n), iVar8 == 0)))) {
        StringWithFormat<char>(&local_70,"%u");
        plVar9 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_70,0,(char *)0x0,
                                    (ulong)(pPVar6->Name)._M_dataplus._M_p);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        psVar12 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_50.field_2._M_allocated_capacity = *psVar12;
          local_50.field_2._8_8_ = plVar9[3];
        }
        else {
          local_50.field_2._M_allocated_capacity = *psVar12;
          local_50._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_50._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::_M_append
                  (tab.field_2._M_local_buf + 8,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)pPVar6);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        if (iVar8 == 0) {
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"AcceptPVMRoot","");
        }
        else {
          pcVar5 = (pPVar6->Name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar5,pcVar5 + (pPVar6->Name)._M_string_length);
        }
        std::__cxx11::string::_M_append
                  (tab.field_2._M_local_buf + 8,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar13,
                     ":\n",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_120);
      plVar9 = (long *)std::__cxx11::string::_M_append((char *)psVar13,(ulong)local_120);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      psVar12 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_90.field_2._M_allocated_capacity = *psVar12;
        local_90.field_2._8_8_ = plVar9[3];
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar12;
        local_90._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_90._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_120);
      psVar12 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_70.field_2._M_allocated_capacity = *psVar12;
        local_70.field_2._8_8_ = plVar9[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar12;
        local_70._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_70._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      psVar12 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_50.field_2._M_allocated_capacity = *psVar12;
        local_50.field_2._8_8_ = plVar9[3];
      }
      else {
        local_50.field_2._M_allocated_capacity = *psVar12;
        local_50._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_50._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::_M_append(tab.field_2._M_local_buf + 8,(ulong)local_50._M_dataplus._M_p)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count != &local_a0) {
        operator_delete((void *)grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        local_a0._M_allocated_capacity + 1);
      }
      sVar19 = sVar19 + 1;
    } while (sVar19 != local_168);
  }
  paVar18 = &local_70.field_2;
  grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count,local_120
             ,tab._M_dataplus._M_p + (long)local_120);
  std::__cxx11::string::append
            ((char *)&grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count);
  paVar1 = &local_50.field_2;
  plVar9 = (long *)std::__cxx11::string::_M_append
                             ((char *)&grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count,(ulong)local_120);
  pGVar7 = local_170;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_90.field_2._M_allocated_capacity = *psVar12;
    local_90.field_2._8_8_ = plVar9[3];
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar12;
    local_90._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_90._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_90);
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_70.field_2._M_allocated_capacity = *psVar12;
    local_70.field_2._8_8_ = plVar9[3];
    local_70._M_dataplus._M_p = (pointer)paVar18;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar12;
    local_70._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_70._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_50.field_2._M_allocated_capacity = *psVar12;
    local_50.field_2._8_8_ = plVar9[3];
    local_50._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar12;
    local_50._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_50._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::_M_append(tab.field_2._M_local_buf + 8,(ulong)local_50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar18) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count != &local_a0) {
    operator_delete((void *)grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    local_a0._M_allocated_capacity + 1);
  }
  sVar19 = local_168;
  if ((pGVar7->namespaceName)._M_string_length != 0) {
    std::operator+(&local_70,"\n} // namespace ",local_150);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
    psVar12 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_50.field_2._M_allocated_capacity = *psVar12;
      local_50.field_2._8_8_ = plVar9[3];
      local_50._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_50.field_2._M_allocated_capacity = *psVar12;
      local_50._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_50._M_string_length = plVar9[1];
    *plVar9 = (long)psVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::_M_append(tab.field_2._M_local_buf + 8,(ulong)local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar18) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
           *)((long)&dest.field_2 + 8));
  std::__cxx11::string::swap((string *)str);
  if (auStack_148 != (undefined1  [8])0x0) {
LAB_00122a5d:
    operator_delete((void *)auStack_148,
                    (long)prods.
                          super__Vector_base<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_148);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
               *)((long)&dest.field_2 + 8));
  if ((size_type *)tab.field_2._8_8_ != &dest._M_string_length) {
    operator_delete((void *)tab.field_2._8_8_,
                    CONCAT71(dest._M_string_length._1_7_,(undefined1)dest._M_string_length) + 1);
  }
  if (local_120 != (undefined1  [8])&tab._M_string_length) {
    operator_delete((void *)local_120,tab._M_string_length + 1);
  }
  return sVar19;
}

Assistant:

size_t GrammarOutputC::CreateProductionSwitch(String& str, const String& className,
                                              const String& stackName, const String& prefix,
                                              const String& enumClassName) const {
    if (!pGrammar)
        return 0u;

    const String tab = "    ";
    String dest;

    // Begin namespace declaration of needed
    if (!namespaceName.empty())
        dest += "namespace " + namespaceName + "\n{\n\n";

    // *** Function declaration

    dest += "bool " + className + "::Reduce(Parse<" + stackName +
            "> &parse, unsigned productionID)\n{\n";

    // *** Switch statement declaration

    if (useEnumClasses)
        dest += tab + "switch (static_cast<" + enumClassName + ">(productionID))\n";
    else
        dest += tab + "switch (productionID)\n";

    dest += tab + "{\n";

    // *** Case statements

    // Create inverse symbols for string lookup
    std::map<unsigned, const String*> grammarSymbolsInv;
    pGrammar->GetInverseGrammarSymbols(grammarSymbolsInv);

    // Go through productions and assign pointers
    std::vector<Production*> prods;
    const auto size = pGrammar->CreateProductionVector(prods);

    // If there are multiple productions with the same name,
    // this counter will be used to generate different labels for them
    size_t sameNameCounter = 1u;

    // Go through the productions and build case statements
    // Starting from the 2nd, the first is always Accept
    for (size_t i = 1u; i < size; ++i) {
        // Return immediately in case of the empty production name
        if (prods[i]->Name.empty())
            return 0u;

        // Store the comment
        dest += tab + tab + "// " + *grammarSymbolsInv[prods[i]->Left] + " -> ";

        if (prods[i]->Length > 0u) {
            for (unsigned k = 0u; k < prods[i]->Length; ++k) {
                if (prods[i]->Right(k) & ProductionMask::Terminal)
                    dest += "'" + *grammarSymbolsInv[prods[i]->Right(k)] + "'";
                else
                    dest += *grammarSymbolsInv[prods[i]->Right(k)];
                dest += " ";
            }
        } else {
            dest += "<empty>";
        }

        dest += "\n";

        // Store the case statements
        dest += tab + tab + "case " + (useEnumClasses ? enumClassName + "::" + prefix : prefix);

        const auto& productionName = prods[i]->Name;

        // If there are multiple productions with the same name,
        // generate different labels for them
        if (productionName == prods[i - 1u]->Name) {
            ++sameNameCounter;
            dest += productionName + StringWithFormat("%u", sameNameCounter);
        } else {
            sameNameCounter = 1u;
            // Check why this special case exists
            dest += productionName == "[Accept9]" ? String{"AcceptPVMRoot"} : productionName;
        }

        dest += ":\n" + tab + tab + tab + "break;\n\n";
    }

    dest += tab + "}\n" + tab + "return true;\n" + "}\n";

    // Close namespace declaration of needed
    if (!namespaceName.empty())
        dest += "\n} // namespace " + namespaceName + "\n";

    // Clear the grammar symbol table because it did not originally exist
    grammarSymbolsInv.clear();

    str.swap(dest);

    return size;
}